

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O0

void parse_args(char **argv)

{
  char *pcVar1;
  char **local_10;
  char **argv_local;
  
  if (*argv == (char *)0x0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0x10d,"parse_args");
    fprintf(_stderr,"Usage: bench_simul dir [arg=val] [...]");
    fprintf(_stderr,"\n");
    abort();
  }
  local_10 = argv + 1;
  dir = *argv;
  if ((*dir != '.') && (pcVar1 = strchr(dir,0x2f), pcVar1 == (char *)0x0)) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0x119,"parse_args");
    fprintf(_stderr,"implausible dir -- prefix with ./ if you want %s",dir);
    fprintf(_stderr,"\n");
    abort();
  }
  for (; *local_10 != (char *)0x0; local_10 = local_10 + 1) {
    parse_param_arg(*local_10);
  }
  return;
}

Assistant:

static void parse_args(const char **argv)
{
	if (! *argv)
		UT_FATAL("Usage: "PROG" dir [arg=val] [...]");
	dir = *argv++;

	/*
	 * The dir argument is mandatory, but I expect users to forget about
	 * it most of the time.  Thus, let's validate it, requiring ./foo
	 * for local paths (almost anyone will use /tmp/ or /path/to/pmem).
	 * And, it's only for benchmarks anyway.
	 */
	if (*dir != '.' && !strchr(dir, '/'))
		UT_FATAL(
			"implausible dir -- prefix with ./ if you want %s",
			dir);

	for (; *argv; argv++)
		parse_param_arg(*argv);
}